

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O0

void ObserverManager::subscribe<FooBarProtocol,B>(B *observer)

{
  mapped_type *pp_Var1;
  B *observer_local;
  
  if (observer != (B *)0x0) {
    pp_Var1 = std::
              unordered_map<unsigned_long,_void_(*)(BaseObserverProtocol_*),_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>_>
              ::operator[](&unsubscribeMap,
                           &(observer->super_FooBarProtocol).super_BaseObserverProtocol.observerId);
    *pp_Var1 = ObserverContainer<FooBarProtocol>::removeObserver;
    ObserverContainer<FooBarProtocol>::addObserver(&observer->super_FooBarProtocol);
  }
  return;
}

Assistant:

static void subscribe(O* observer) {
        static_assert(std::is_base_of<BaseObserverProtocol, O>::value,
                      "All observers must inherit from BaseObserverProtocol");
        if (observer == nullptr) {
            return;
        }

        unsubscribeMap[observer->P::observerId] = &ObserverContainer<P>::removeObserver;
        ObserverContainer<P>::addObserver(observer);
    }